

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::generate_deserialize_container
          (t_lua_generator *this,ostream *out,t_type *ttype,bool local,string *prefix)

{
  int *piVar1;
  pointer pcVar2;
  t_type *ptVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string size;
  string etype;
  string vtype;
  string ktype;
  t_field fetype;
  t_field fvtype;
  t_field fktype;
  t_field fsize;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  t_field local_2f0;
  t_field local_240;
  t_field local_190;
  t_field local_e0;
  
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"_size","");
  t_generator::tmp(&local_4d0,(t_generator *)this,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"_ktype","");
  t_generator::tmp(&local_470,(t_generator *)this,&local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"_vtype","");
  t_generator::tmp(&local_490,(t_generator *)this,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"_etype","");
  t_generator::tmp(&local_4b0,(t_generator *)this,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  ptVar3 = g_type_i32;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_390,local_4d0._M_dataplus._M_p,
             local_4d0._M_dataplus._M_p + local_4d0._M_string_length);
  t_field::t_field(&local_e0,ptVar3,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  ptVar3 = g_type_i8;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_470._M_dataplus._M_p,
             local_470._M_dataplus._M_p + local_470._M_string_length);
  t_field::t_field(&local_190,ptVar3,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  ptVar3 = g_type_i8;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,local_490._M_dataplus._M_p,
             local_490._M_dataplus._M_p + local_490._M_string_length);
  t_field::t_field(&local_240,ptVar3,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  ptVar3 = g_type_i8;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,local_4b0._M_dataplus._M_p,
             local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
  t_field::t_field(&local_2f0,ptVar3,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  pcVar7 = "";
  if (local) {
    pcVar7 = "local ";
  }
  lVar6 = 6;
  if (!local) {
    lVar6 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = {}",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((char)iVar4 != '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"local ",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = iprot:readSetBegin()",0x17);
      goto LAB_002b1514;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
    if ((char)iVar4 != '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"local ",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = iprot:readListBegin()",0x18);
      goto LAB_002b1514;
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"local ",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_470._M_dataplus._M_p,local_470._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_490._M_dataplus._M_p,local_490._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = iprot:readMapBegin() ",0x18);
LAB_002b1514:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"for _i=1,",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," do",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((char)iVar4 != '\0') {
      paVar9 = &local_430.field_2;
      pcVar2 = (prefix->_M_dataplus)._M_p;
      local_430._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_430,pcVar2,pcVar2 + prefix->_M_string_length);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_430);
      _Var8._M_p = local_430._M_dataplus._M_p;
      goto LAB_002b1698;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
    if ((char)iVar4 != '\0') {
      paVar9 = &local_450.field_2;
      pcVar2 = (prefix->_M_dataplus)._M_p;
      local_450._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_450,pcVar2,pcVar2 + prefix->_M_string_length);
      generate_deserialize_list_element(this,out,(t_list *)ttype,&local_450);
      _Var8._M_p = local_450._M_dataplus._M_p;
      goto LAB_002b1698;
    }
  }
  else {
    paVar9 = &local_410.field_2;
    pcVar2 = (prefix->_M_dataplus)._M_p;
    local_410._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_410,pcVar2,pcVar2 + prefix->_M_string_length);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_410);
    _Var8._M_p = local_410._M_dataplus._M_p;
LAB_002b1698:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar9) {
      operator_delete(_Var8._M_p);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((char)iVar4 == '\0') goto LAB_002b1791;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iprot:readListEnd()",0x13);
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iprot:readSetEnd()",0x12);
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"iprot:readMapEnd()",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002b1791:
  t_field::~t_field(&local_2f0);
  t_field::~t_field(&local_240);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_container(ostream& out,
                                                     t_type* ttype,
                                                     bool local,
                                                     string prefix) {
  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  // Declare variables, read header
  indent(out) << (local ? "local " : "") << prefix << " = {}" << endl;
  if (ttype->is_map()) {
    indent(out) << "local " << ktype << ", " << vtype << ", " << size << " = iprot:readMapBegin() "
                << endl;
  } else if (ttype->is_set()) {
    indent(out) << "local " << etype << ", " << size << " = iprot:readSetBegin()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "local " << etype << ", " << size << " = iprot:readListBegin()" << endl;
  }

  // Deserialize
  indent(out) << "for _i=1," << size << " do" << endl;
  indent_up();

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  indent_down();
  indent(out) << "end" << endl;

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "iprot:readMapEnd()" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "iprot:readSetEnd()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "iprot:readListEnd()" << endl;
  }
}